

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_cwksp *ws;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  int iVar3;
  int iVar4;
  ZSTD_cwksp_alloc_phase_e ZVar5;
  BYTE *pBVar6;
  ZSTD_freeFunction p_Var7;
  void *pvVar8;
  ZSTD_allocFunction p_Var9;
  seqDef *psVar10;
  ldmEntry_t *plVar11;
  rawSeq *prVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  U32 UVar15;
  bool bVar16;
  U64 UVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  BYTE *pBVar26;
  ulong uVar27;
  size_t sVar28;
  void *pvVar29;
  seqDef *psVar30;
  ulong uVar31;
  ZSTD_compressedBlockState_t *pZVar32;
  U32 *pUVar33;
  ldmEntry_t *__s;
  rawSeq *prVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  ZSTD_indexResetPolicy_e local_7c;
  size_t local_78;
  
  if (((((params.cParams.windowLog - 0x20 < 0xffffffea) ||
        (params.cParams.chainLog - 0x1f < 0xffffffe7)) ||
       (params.cParams.hashLog - 0x1f < 0xffffffe7)) ||
      ((params.cParams.searchLog - 0x1f < 0xffffffe2 || (4 < params.cParams.minMatch - 3)))) ||
     ((0x20000 < params.cParams.targetLength || (8 < params.cParams.strategy - ZSTD_fast)))) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2fc8,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fcf,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fd0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (params.ldmParams.minMatchLength - 1 == 0) {
      UVar17 = 1;
    }
    else {
      lVar23 = -0x30e44323485a9b9d;
      UVar17 = 1;
      uVar24 = (ulong)(params.ldmParams.minMatchLength - 1);
      do {
        lVar25 = lVar23;
        if ((uVar24 & 1) == 0) {
          lVar25 = 1;
        }
        UVar17 = UVar17 * lVar25;
        lVar23 = lVar23 * lVar23;
        bVar37 = 1 < uVar24;
        uVar24 = uVar24 >> 1;
      } while (bVar37);
    }
    (zc->ldmState).hashPower = UVar17;
  }
  if (pledgedSrcSize == 0) {
    uVar24 = 1;
  }
  else {
    uVar24 = 1L << ((byte)params.cParams.windowLog & 0x3f);
    if (pledgedSrcSize <= uVar24) {
      uVar24 = pledgedSrcSize;
    }
  }
  uVar27 = 0x20000;
  if (uVar24 < 0x20000) {
    uVar27 = uVar24;
  }
  local_78 = 0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (ulong)(params.cParams.minMatch != 3) + 3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar27;
  sVar18 = SUB168(auVar14 / auVar13,0);
  uVar19 = (ulong)(uint)(SUB164(auVar14 / auVar13,0) * 8);
  if (zbuff == ZSTDb_buffered) {
    uVar31 = 0;
    if (uVar24 < 0x20000) {
      uVar31 = (ulong)(0x20000U - (int)uVar27 >> 0xb);
    }
    local_78 = (uVar27 >> 8) + uVar27 + uVar31 + 1;
  }
  uVar31 = 0;
  uVar24 = uVar24 + uVar27;
  if (zbuff != ZSTDb_buffered) {
    uVar24 = uVar31;
  }
  sVar20 = ZSTD_sizeof_matchState(&params.cParams,1);
  uVar21 = 0;
  if (params.ldmParams.enableLdm != 0) {
    uVar21 = uVar27 / params.ldmParams.minMatchLength;
  }
  iVar3 = zc->initialized;
  pBVar6 = (zc->blockState).matchState.window.nextSrc;
  pBVar26 = (zc->blockState).matchState.window.base;
  iVar4 = (zc->workspace).workspaceOversizedDuration;
  (zc->workspace).workspaceOversizedDuration = iVar4 + 1;
  uVar22 = (ulong)(params.ldmParams.hashLog - params.ldmParams.bucketSizeLog);
  if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
    uVar22 = uVar31;
  }
  if (params.ldmParams.enableLdm != 0) {
    uVar31 = (8L << ((byte)params.ldmParams.hashLog & 0x3f)) + (1L << ((byte)uVar22 & 0x3f));
  }
  lVar25 = sVar18 * 3 + local_78 + uVar27 + uVar24 + uVar19 + sVar20;
  bVar37 = zc->staticSize == 0;
  lVar23 = lVar25 + 0x3be0;
  if (!bVar37) {
    lVar23 = lVar25 + 0x4068;
  }
  uVar31 = lVar23 + uVar21 * 0xc + uVar31 + 0x20;
  pvVar29 = (zc->workspace).workspace;
  bVar35 = uVar31 <= (ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar29);
  bVar36 = (ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < uVar31 * 3;
  bVar16 = (iVar4 < 0x80 || bVar36) && bVar35;
  ws = &zc->workspace;
  if (bVar37 && (iVar4 >= 0x80 && !bVar36 || !bVar35)) {
    p_Var7 = (zc->customMem).customFree;
    pvVar8 = (zc->customMem).opaque;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).allocFailed = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    *(undefined8 *)&(zc->workspace).phase = 0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    if (pvVar29 != (void *)0x0) {
      if (p_Var7 == (ZSTD_freeFunction)0x0) {
        free(pvVar29);
      }
      else {
        (*p_Var7)(pvVar8,pvVar29);
      }
    }
    p_Var9 = (zc->customMem).customAlloc;
    if (p_Var9 == (ZSTD_allocFunction)0x0) {
      pvVar29 = malloc(uVar31);
    }
    else {
      pvVar29 = (*p_Var9)((zc->customMem).opaque,uVar31);
    }
    if (pvVar29 == (void *)0x0) {
      sVar20 = 0xffffffffffffffc0;
    }
    else {
      if (((ulong)pvVar29 & 7) != 0) {
        __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1dad,"void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t)");
      }
      (zc->workspace).workspace = pvVar29;
      (zc->workspace).workspaceEnd = (void *)(uVar31 + (long)pvVar29);
      (zc->workspace).objectEnd = pvVar29;
      (zc->workspace).tableValidEnd = pvVar29;
      (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
      (zc->workspace).tableEnd = pvVar29;
      (zc->workspace).allocStart = (void *)(uVar31 + (long)pvVar29);
      sVar20 = 0;
      (zc->workspace).allocFailed = 0;
      ZSTD_cwksp_assert_internal_consistency(ws);
      (zc->workspace).workspaceOversizedDuration = 0;
      ZSTD_cwksp_assert_internal_consistency(ws);
    }
    local_7c = ZSTDirp_reset;
    if (pvVar29 != (void *)0x0) {
      if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x23e0) {
        __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3011,
                      "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                     );
      }
      pZVar32 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
      if (((ulong)pZVar32 & 7) != 0) {
LAB_00170409:
        __assert_fail("((size_t)alloc & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1d30,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (((zc->workspace).phase == ZSTD_cwksp_alloc_objects) &&
         (pZVar1 = pZVar32 + 1,
         pZVar1 <= (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd)) {
        (zc->workspace).objectEnd = pZVar1;
        (zc->workspace).tableEnd = pZVar1;
        (zc->workspace).tableValidEnd = pZVar1;
      }
      else {
        (zc->workspace).allocFailed = 1;
        pZVar32 = (ZSTD_compressedBlockState_t *)0x0;
      }
      (zc->blockState).prevCBlock = pZVar32;
      if (pZVar32 != (ZSTD_compressedBlockState_t *)0x0) {
        pZVar32 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
        if (((ulong)pZVar32 & 7) != 0) goto LAB_00170409;
        ZSTD_cwksp_assert_internal_consistency(ws);
        if (((zc->workspace).phase == ZSTD_cwksp_alloc_objects) &&
           (pZVar1 = pZVar32 + 1,
           pZVar1 <= (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd)) {
          (zc->workspace).objectEnd = pZVar1;
          (zc->workspace).tableEnd = pZVar1;
          (zc->workspace).tableValidEnd = pZVar1;
        }
        else {
          (zc->workspace).allocFailed = 1;
          pZVar32 = (ZSTD_compressedBlockState_t *)0x0;
        }
        (zc->blockState).nextCBlock = pZVar32;
        if (pZVar32 != (ZSTD_compressedBlockState_t *)0x0) {
          pUVar33 = (U32 *)(zc->workspace).objectEnd;
          if (((ulong)pUVar33 & 7) != 0) goto LAB_00170409;
          ZSTD_cwksp_assert_internal_consistency(ws);
          if (((zc->workspace).phase == ZSTD_cwksp_alloc_objects) &&
             (pUVar2 = pUVar33 + 0x600, pUVar2 <= (zc->workspace).workspaceEnd)) {
            (zc->workspace).objectEnd = pUVar2;
            (zc->workspace).tableEnd = pUVar2;
            (zc->workspace).tableValidEnd = pUVar2;
          }
          else {
            (zc->workspace).allocFailed = 1;
            pUVar33 = (U32 *)0x0;
          }
          zc->entropyWorkspace = pUVar33;
          bVar16 = (zc->blockState).nextCBlock != (ZSTD_compressedBlockState_t *)0x0;
          if (!bVar16) {
            sVar20 = 0xffffffffffffffc0;
          }
          goto LAB_0016fc3d;
        }
      }
      bVar16 = false;
      goto LAB_0016fc32;
    }
    bVar16 = false;
  }
  else {
    local_7c = (ZSTD_indexResetPolicy_e)
               (0xdf000000 < (ulong)((long)pBVar6 - (long)pBVar26) || iVar3 == 0);
LAB_0016fc32:
    sVar20 = 0xffffffffffffffc0;
  }
LAB_0016fc3d:
  if (!bVar16) {
    return sVar20;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (zc->workspace).workspaceEnd;
  (zc->workspace).allocFailed = 0;
  if (1 < (int)(zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  memcpy(&zc->appliedParams,&params,0x90);
  (zc->blockState).matchState.cParams.windowLog = params.cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = SUB168(ZEXT816(0) << 0x20,0);
  zc->producedCSize = SUB168(ZEXT816(0) << 0x20,8);
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar27;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v1 = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v3 = 0;
  (zc->xxhState).v4 = 0x61c8864e7a143579;
  (zc->xxhState).mem64[0] = 0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  (zc->xxhState).mem64[3] = 0;
  (zc->xxhState).memsize = 0;
  (zc->xxhState).reserved[0] = 0;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  pZVar32 = (zc->blockState).prevCBlock;
  lVar23 = 0;
  do {
    *(undefined4 *)((long)pZVar32->rep + lVar23) = *(undefined4 *)((long)repStartValue + lVar23);
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0xc);
  (pZVar32->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar32->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar32->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar32->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  ZVar5 = (zc->workspace).phase;
  if (1 < (int)ZVar5) {
LAB_001703a9:
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1cac,
                  "void ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)");
  }
  pBVar6 = (BYTE *)(zc->workspace).tableEnd;
  if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  pBVar26 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - uVar27));
  ZSTD_cwksp_assert_internal_consistency(ws);
  if (pBVar6 <= pBVar26) {
    if (pBVar26 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar26;
    }
    (zc->workspace).allocStart = pBVar26;
    (zc->seqStore).litStart = pBVar26;
    (zc->seqStore).maxNbLit = uVar27;
    zc->inBuffSize = uVar24;
    ZVar5 = (zc->workspace).phase;
    if (1 < (int)ZVar5) goto LAB_001703a9;
    pBVar6 = (BYTE *)(zc->workspace).tableEnd;
    if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
    }
    pBVar26 = pBVar26 + -uVar24;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar6 <= pBVar26) {
      if (pBVar26 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar26;
      }
      (zc->workspace).allocStart = pBVar26;
      zc->inBuff = (char *)pBVar26;
      zc->outBuffSize = local_78;
      ZVar5 = (zc->workspace).phase;
      if (1 < (int)ZVar5) goto LAB_001703a9;
      pBVar6 = (BYTE *)(zc->workspace).tableEnd;
      if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
        (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      }
      pBVar26 = pBVar26 + -local_78;
      ZSTD_cwksp_assert_internal_consistency(ws);
      UVar15 = params.ldmParams.enableLdm;
      if (pBVar6 <= pBVar26) {
        if (pBVar26 < (zc->workspace).tableValidEnd) {
          (zc->workspace).tableValidEnd = pBVar26;
        }
        (zc->workspace).allocStart = pBVar26;
        zc->outBuff = (char *)pBVar26;
        if (params.ldmParams.enableLdm != 0) {
          sVar28 = 1L << ((char)params.ldmParams.hashLog - (char)params.ldmParams.bucketSizeLog &
                         0x3fU);
          ZVar5 = (zc->workspace).phase;
          if (1 < (int)ZVar5) goto LAB_001703a9;
          pBVar6 = (BYTE *)(zc->workspace).tableEnd;
          if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
            (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
            (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
          }
          pBVar26 = pBVar26 + -sVar28;
          ZSTD_cwksp_assert_internal_consistency(ws);
          if (pBVar26 < pBVar6) goto LAB_001703cb;
          if (pBVar26 < (zc->workspace).tableValidEnd) {
            (zc->workspace).tableValidEnd = pBVar26;
          }
          (zc->workspace).allocStart = pBVar26;
          (zc->ldmState).bucketOffsets = pBVar26;
          memset(pBVar26,0,sVar28);
        }
        if ((zc->stage == ZSTDcs_init) && ((zc->appliedParams).ldmParams.enableLdm == 0)) {
          (zc->externSeqStore).seq = (rawSeq *)0x0;
          (zc->externSeqStore).pos = 0;
          (zc->externSeqStore).size = 0;
          (zc->externSeqStore).capacity = 0;
        }
        (zc->seqStore).maxNbSeq = sVar18;
        ZVar5 = (zc->workspace).phase;
        if (1 < (int)ZVar5) goto LAB_001703a9;
        pBVar6 = (BYTE *)(zc->workspace).tableEnd;
        if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
          (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
          (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        }
        pBVar26 = (BYTE *)((long)(zc->workspace).allocStart - sVar18);
        ZSTD_cwksp_assert_internal_consistency(ws);
        if (pBVar6 <= pBVar26) {
          if (pBVar26 < (zc->workspace).tableValidEnd) {
            (zc->workspace).tableValidEnd = pBVar26;
          }
          (zc->workspace).allocStart = pBVar26;
          (zc->seqStore).llCode = pBVar26;
          ZVar5 = (zc->workspace).phase;
          if (1 < (int)ZVar5) goto LAB_001703a9;
          pBVar6 = (BYTE *)(zc->workspace).tableEnd;
          if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
            (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
            (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
          }
          pBVar26 = pBVar26 + -sVar18;
          ZSTD_cwksp_assert_internal_consistency(ws);
          if (pBVar6 <= pBVar26) {
            if (pBVar26 < (zc->workspace).tableValidEnd) {
              (zc->workspace).tableValidEnd = pBVar26;
            }
            (zc->workspace).allocStart = pBVar26;
            (zc->seqStore).mlCode = pBVar26;
            ZVar5 = (zc->workspace).phase;
            if (1 < (int)ZVar5) goto LAB_001703a9;
            pBVar6 = (BYTE *)(zc->workspace).tableEnd;
            if (ZVar5 != ZSTD_cwksp_alloc_buffers) {
              (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
              (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
            }
            pBVar26 = pBVar26 + -sVar18;
            ZSTD_cwksp_assert_internal_consistency(ws);
            if (pBVar6 <= pBVar26) {
              if (pBVar26 < (zc->workspace).tableValidEnd) {
                (zc->workspace).tableValidEnd = pBVar26;
              }
              (zc->workspace).allocStart = pBVar26;
              (zc->seqStore).ofCode = pBVar26;
              ZVar5 = (zc->workspace).phase;
              if (2 < (int)ZVar5) goto LAB_001703a9;
              psVar10 = (seqDef *)(zc->workspace).tableEnd;
              if (ZVar5 != ZSTD_cwksp_alloc_aligned) {
                if ((int)ZVar5 < 1) {
                  (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
                }
                pvVar29 = (void *)((ulong)pBVar26 & 0xfffffffffffffffc);
                (zc->workspace).allocStart = pvVar29;
                if (pvVar29 < (zc->workspace).tableValidEnd) {
                  (zc->workspace).tableValidEnd = pvVar29;
                }
                (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
              }
              psVar30 = (seqDef *)((long)(zc->workspace).allocStart - uVar19);
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (psVar10 <= psVar30) {
                if (psVar30 < (seqDef *)(zc->workspace).tableValidEnd) {
                  (zc->workspace).tableValidEnd = psVar30;
                }
                (zc->workspace).allocStart = psVar30;
                (zc->seqStore).sequencesStart = psVar30;
                sVar18 = ZSTD_reset_matchState
                                   (&(zc->blockState).matchState,ws,&params.cParams,crp,local_7c,
                                    ZSTD_resetTarget_CCtx);
                if (0xffffffffffffff88 < sVar18) {
                  return sVar18;
                }
                if (UVar15 == 0) {
LAB_00170339:
                  zc->initialized = 1;
                  return 0;
                }
                sVar28 = 8L << ((byte)params.ldmParams.hashLog & 0x3f);
                ZVar5 = (zc->workspace).phase;
                if (2 < (int)ZVar5) goto LAB_001703a9;
                plVar11 = (ldmEntry_t *)(zc->workspace).tableEnd;
                if (ZVar5 != ZSTD_cwksp_alloc_aligned) {
                  if ((int)ZVar5 < 1) {
                    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
                  }
                  pvVar29 = (void *)((ulong)(zc->workspace).allocStart & 0xfffffffffffffffc);
                  (zc->workspace).allocStart = pvVar29;
                  if (pvVar29 < (zc->workspace).tableValidEnd) {
                    (zc->workspace).tableValidEnd = pvVar29;
                  }
                  (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
                }
                __s = (ldmEntry_t *)((long)(zc->workspace).allocStart - sVar28);
                ZSTD_cwksp_assert_internal_consistency(ws);
                if (plVar11 <= __s) {
                  if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
                    (zc->workspace).tableValidEnd = __s;
                  }
                  (zc->workspace).allocStart = __s;
                  (zc->ldmState).hashTable = __s;
                  memset(__s,0,sVar28);
                  ZVar5 = (zc->workspace).phase;
                  if (2 < (int)ZVar5) goto LAB_001703a9;
                  prVar12 = (rawSeq *)(zc->workspace).tableEnd;
                  if (ZVar5 != ZSTD_cwksp_alloc_aligned) {
                    if ((int)ZVar5 < 1) {
                      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
                    }
                    pvVar29 = (void *)((ulong)(zc->workspace).allocStart & 0xfffffffffffffffc);
                    (zc->workspace).allocStart = pvVar29;
                    if (pvVar29 < (zc->workspace).tableValidEnd) {
                      (zc->workspace).tableValidEnd = pvVar29;
                    }
                    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
                  }
                  prVar34 = (rawSeq *)((long)(zc->workspace).allocStart + uVar21 * -0xc);
                  ZSTD_cwksp_assert_internal_consistency(ws);
                  if (prVar12 <= prVar34) {
                    if (prVar34 < (rawSeq *)(zc->workspace).tableValidEnd) {
                      (zc->workspace).tableValidEnd = prVar34;
                    }
                    (zc->workspace).allocStart = prVar34;
                    zc->ldmSequences = prVar34;
                    zc->maxNbLdmSequences = uVar21;
                    (zc->ldmState).window.nextSrc = (BYTE *)0x0;
                    (zc->ldmState).window.base = (BYTE *)0x0;
                    (zc->ldmState).window.dictBase = (BYTE *)0x0;
                    (zc->ldmState).window.dictLimit = 0;
                    (zc->ldmState).window.lowLimit = 0;
                    (zc->ldmState).window.base = "";
                    (zc->ldmState).window.dictBase = "";
                    (zc->ldmState).window.dictLimit = 1;
                    (zc->ldmState).window.lowLimit = 1;
                    (zc->ldmState).window.nextSrc =
                         (BYTE *)"num chunks = %li (bit plane) and %li (exponent) \n";
                    goto LAB_00170339;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001703cb:
  __assert_fail("alloc >= bottom",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1cdd,
                "void *ZSTD_cwksp_reserve_internal(ZSTD_cwksp *, size_t, ZSTD_cwksp_alloc_phase_e)")
  ;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 const pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    zc->isFirstBlock = 1;

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);

        ZSTD_indexResetPolicy_e needsIndexReset = zc->initialized ? ZSTDirp_continue : ZSTDirp_reset;

        if (ZSTD_indexTooCloseToMax(zc->blockState.matchState.window)) {
            needsIndexReset = ZSTDirp_reset;
        }

        ZSTD_cwksp_bump_oversized_duration(ws, 0);

        /* Check if workspace is large enough, alloc a new one if needed */
        {   size_t const cctxSpace = zc->staticSize ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;
            size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
            size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
            size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize) + ZSTD_cwksp_alloc_size(buffOutSize);
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(maxNbLdmSeq * sizeof(rawSeq));

            size_t const neededSpace =
                cctxSpace +
                entropySpace +
                blockStateSpace +
                ldmSpace +
                ldmSeqSpace +
                matchStateSize +
                tokenSpace +
                bufferSpace;

            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workspaceTooSmall || workspaceWasteful) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem));

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, HUF_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, ldmBucketSize);
            memset(zc->ldmState.bucketOffsets, 0, ldmBucketSize);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params.cParams,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx));

        /* ldm hash table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            ZSTD_window_clear(&zc->ldmState.window);
        }

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        zc->initialized = 1;

        return 0;
    }
}